

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-ecc.c
# Opt level: O2

int ndn_ecdsa_verify(uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size,
                    ndn_ecc_pub_t *ecc_pub_key)

{
  int iVar1;
  uint8_t auStack_48 [8];
  uint8_t hash_result [32];
  
  hash_result[8] = '\0';
  hash_result[9] = '\0';
  hash_result[10] = '\0';
  hash_result[0xb] = '\0';
  hash_result[0xc] = '\0';
  hash_result[0xd] = '\0';
  hash_result[0xe] = '\0';
  hash_result[0xf] = '\0';
  hash_result[0x10] = '\0';
  hash_result[0x11] = '\0';
  hash_result[0x12] = '\0';
  hash_result[0x13] = '\0';
  hash_result[0x14] = '\0';
  hash_result[0x15] = '\0';
  hash_result[0x16] = '\0';
  hash_result[0x17] = '\0';
  auStack_48[0] = '\0';
  auStack_48[1] = '\0';
  auStack_48[2] = '\0';
  auStack_48[3] = '\0';
  auStack_48[4] = '\0';
  auStack_48[5] = '\0';
  auStack_48[6] = '\0';
  auStack_48[7] = '\0';
  hash_result[0] = '\0';
  hash_result[1] = '\0';
  hash_result[2] = '\0';
  hash_result[3] = '\0';
  hash_result[4] = '\0';
  hash_result[5] = '\0';
  hash_result[6] = '\0';
  hash_result[7] = '\0';
  iVar1 = ndn_sha256(input_value,input_size,auStack_48);
  if (iVar1 == 0) {
    iVar1 = (*ndn_ecc_backend.ecdsa_verify)
                      (auStack_48,0x20,sig_value,sig_size,&ecc_pub_key->abs_key,
                       ecc_pub_key->curve_type);
  }
  else {
    iVar1 = -0x19;
  }
  return iVar1;
}

Assistant:

int
ndn_ecdsa_verify(const uint8_t* input_value, uint32_t input_size,
                 const uint8_t* sig_value, uint32_t sig_size,
                 const ndn_ecc_pub_t* ecc_pub_key)
{
  uint8_t hash_result[NDN_SEC_SHA256_HASH_SIZE] = {0};
  if (ndn_sha256(input_value, input_size, hash_result) != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;

  return ndn_ecc_backend.ecdsa_verify(hash_result, sizeof(hash_result),
                                      sig_value, sig_size,
                                      &ecc_pub_key->abs_key, ecc_pub_key->curve_type);
}